

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_math.c
# Opt level: O0

REF_STATUS ref_math_normalize(REF_DBL *normal)

{
  double dVar1;
  double local_70;
  double local_68;
  double local_58;
  double local_50;
  double local_40;
  double local_38;
  double local_28;
  REF_DBL length;
  REF_DBL *normal_local;
  
  dVar1 = sqrt(normal[2] * normal[2] + *normal * *normal + normal[1] * normal[1]);
  if (dVar1 * 1e+20 <= 0.0) {
    local_28 = -(dVar1 * 1e+20);
  }
  else {
    local_28 = dVar1 * 1e+20;
  }
  if (*normal <= 0.0) {
    local_38 = -*normal;
  }
  else {
    local_38 = *normal;
  }
  if (local_38 < local_28) {
    if (dVar1 * 1e+20 <= 0.0) {
      local_40 = -(dVar1 * 1e+20);
    }
    else {
      local_40 = dVar1 * 1e+20;
    }
    if (normal[1] <= 0.0) {
      local_50 = -normal[1];
    }
    else {
      local_50 = normal[1];
    }
    if (local_50 < local_40) {
      if (dVar1 * 1e+20 <= 0.0) {
        local_58 = -(dVar1 * 1e+20);
      }
      else {
        local_58 = dVar1 * 1e+20;
      }
      if (normal[2] <= 0.0) {
        local_68 = -normal[2];
      }
      else {
        local_68 = normal[2];
      }
      if (local_68 < local_58) {
        *normal = *normal / dVar1;
        normal[1] = normal[1] / dVar1;
        normal[2] = normal[2] / dVar1;
        local_70 = normal[2] * normal[2] + *normal * *normal + normal[1] * normal[1];
        if (local_70 - 1.0 <= 0.0) {
          local_70 = -(local_70 - 1.0);
        }
        else {
          local_70 = local_70 - 1.0;
        }
        if (1e-13 <= local_70) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_math.c",
                 0x29,"ref_math_normalize","vector length not unity");
          return 1;
        }
        return 0;
      }
    }
  }
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_math_normalize(REF_DBL *normal) {
  REF_DBL length;

  length = sqrt(ref_math_dot(normal, normal));

  if (!ref_math_divisible(normal[0], length) ||
      !ref_math_divisible(normal[1], length) ||
      !ref_math_divisible(normal[2], length))
    return REF_DIV_ZERO;

  normal[0] /= length;
  normal[1] /= length;
  normal[2] /= length;

  length = ref_math_dot(normal, normal);
  RAS((ABS(length - 1.0) < 1.0e-13), "vector length not unity");

  return REF_SUCCESS;
}